

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_Tt7Isop(word *uOn,word *uOnDc,int nVars,word *uRes)

{
  int nVars_00;
  word wVar1;
  word wVar2;
  word wVar3;
  word uRes2;
  word uRes1;
  word uRes0;
  word *pwStack_28;
  int nCubes;
  word *uRes_local;
  word *pwStack_18;
  int nVars_local;
  word *uOnDc_local;
  word *uOn_local;
  
  uRes0._4_4_ = 0;
  pwStack_28 = uRes;
  uRes_local._4_4_ = nVars;
  pwStack_18 = uOnDc;
  uOnDc_local = uOn;
  if ((nVars < 7) || ((*uOn == uOn[1] && (*uOnDc == uOnDc[1])))) {
    wVar1 = *uOn;
    wVar2 = *uOnDc;
    nVars_00 = Abc_MinInt(nVars,6);
    wVar1 = Abc_Tt6Isop(wVar1,wVar2,nVars_00,(int *)((long)&uRes0 + 4));
    pwStack_28[1] = wVar1;
    *pwStack_28 = wVar1;
  }
  else {
    if (nVars != 7) {
      __assert_fail("nVars == 7",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x926,"int Abc_Tt7Isop(word *, word *, int, word *)");
    }
    wVar1 = Abc_Tt6Isop(*uOn & (uOnDc[1] ^ 0xffffffffffffffff),*uOnDc,6,(int *)((long)&uRes0 + 4));
    wVar2 = Abc_Tt6Isop(uOnDc_local[1] & (*pwStack_18 ^ 0xffffffffffffffff),pwStack_18[1],6,
                        (int *)((long)&uRes0 + 4));
    wVar3 = Abc_Tt6Isop(*uOnDc_local & (wVar1 ^ 0xffffffffffffffff) |
                        uOnDc_local[1] & (wVar2 ^ 0xffffffffffffffff),*pwStack_18 & pwStack_18[1],6,
                        (int *)((long)&uRes0 + 4));
    *pwStack_28 = wVar3 | wVar1;
    pwStack_28[1] = wVar3 | wVar2;
    if (((*uOnDc_local & (*pwStack_28 ^ 0xffffffffffffffff)) != 0) ||
       ((uOnDc_local[1] & (pwStack_28[1] ^ 0xffffffffffffffff)) != 0)) {
      __assert_fail("(uOn[0] & ~uRes[0]) == 0 && (uOn[1] & ~uRes[1]) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x92e,"int Abc_Tt7Isop(word *, word *, int, word *)");
    }
    if (((*pwStack_28 & (*pwStack_18 ^ 0xffffffffffffffff)) != 0) ||
       ((pwStack_28[1] & (pwStack_18[1] ^ 0xffffffffffffffff)) != 0)) {
      __assert_fail("(uRes[0] & ~uOnDc[0])==0 && (uRes[1] & ~uOnDc[1])==0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x92f,"int Abc_Tt7Isop(word *, word *, int, word *)");
    }
  }
  return uRes0._4_4_;
}

Assistant:

static inline int Abc_Tt7Isop( word uOn[2], word uOnDc[2], int nVars, word uRes[2] )
{
    int nCubes = 0;
    if ( nVars <= 6 || (uOn[0] == uOn[1] && uOnDc[0] == uOnDc[1]) )
        uRes[0] = uRes[1] = Abc_Tt6Isop( uOn[0], uOnDc[0], Abc_MinInt(nVars, 6), &nCubes );
    else
    {
        word uRes0, uRes1, uRes2;
        assert( nVars == 7 );
        // solve for cofactors
        uRes0 = Abc_Tt6Isop( uOn[0] & ~uOnDc[1], uOnDc[0], 6, &nCubes );
        uRes1 = Abc_Tt6Isop( uOn[1] & ~uOnDc[0], uOnDc[1], 6, &nCubes );
        uRes2 = Abc_Tt6Isop( (uOn[0] & ~uRes0) | (uOn[1] & ~uRes1), uOnDc[0] & uOnDc[1], 6, &nCubes );
        // derive the final truth table
        uRes[0] = uRes2 | uRes0;
        uRes[1] = uRes2 | uRes1;
        assert( (uOn[0] & ~uRes[0]) == 0 && (uOn[1] & ~uRes[1]) == 0 );
        assert( (uRes[0] & ~uOnDc[0])==0 && (uRes[1] & ~uOnDc[1])==0 );
    }
    return nCubes;
}